

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t exr_set_lineorder(exr_context_t ctxt,int part_index,exr_lineorder_t lo)

{
  exr_attribute_t **attr;
  pthread_mutex_t *__mutex;
  exr_priv_part_t p_Var1;
  exr_result_t eVar2;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  exr_attribute_t *peVar3;
  exr_context_t nonc;
  exr_result_t eStackY_40;
  
  if (EXR_LINEORDER_RANDOM_Y < lo) {
    eVar2 = (*ctxt->print_error)
                      (ctxt,4,"\'lineOrder\' value for line order (%d) out of range (%d - %d)",
                       (ulong)lo,0,3);
    return eVar2;
  }
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar2 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar2;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_40 = 0x15;
LAB_001168e4:
    eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,eStackY_40);
    return eVar2;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_40 = 8;
    goto LAB_001168e4;
  }
  p_Var1 = ctxt->parts[(uint)part_index];
  attr = &p_Var1->lineOrder;
  peVar3 = p_Var1->lineOrder;
  if (peVar3 == (exr_attribute_t *)0x0) {
    eVar2 = exr_attr_list_add(ctxt,&p_Var1->attributes,"lineOrder",EXR_ATTR_LINEORDER,0,
                              (uint8_t **)0x0,attr);
    if (eVar2 != 0) goto LAB_00116987;
    peVar3 = *attr;
  }
  else if (peVar3->type != EXR_ATTR_LINEORDER) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar2 = (*ctxt->print_error)
                      (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",(*attr)->type_name
                       ,"lineOrder",ctxt->print_error);
    return eVar2;
  }
  (peVar3->field_6).uc = (uint8_t)lo;
  p_Var1->lineorder = lo;
  eVar2 = 0;
LAB_00116987:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar2;
}

Assistant:

exr_result_t
exr_set_lineorder (exr_context_t ctxt, int part_index, exr_lineorder_t lo)
{
    if (lo >= EXR_LINEORDER_LAST_TYPE)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "'lineOrder' value for line order (%d) out of range (%d - %d)",
            (int) lo,
            0,
            (int) EXR_LINEORDER_LAST_TYPE);

    {
        REQ_ATTR_FIND_CREATE (lineOrder, EXR_ATTR_LINEORDER);
        if (rv == EXR_ERR_SUCCESS)
        {
            attr->uc        = (uint8_t) lo;
            part->lineorder = lo;
        }

        return EXR_UNLOCK_AND_RETURN (rv);
    }
}